

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  internal *piVar4;
  TestResult *pTVar5;
  TestSuite *pTVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *result;
  int local_2e0;
  allocator local_2d9;
  int i;
  allocator local_2b1;
  string local_2b0;
  string local_290;
  int local_26c;
  string local_268;
  allocator local_241;
  string local_240;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  int local_13c;
  string local_138;
  allocator local_111;
  string local_110;
  int local_ec;
  string local_e8;
  allocator local_c1;
  string local_c0;
  int local_9c;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string kTestsuites;
  UnitTest *unit_test_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = unit_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"testsuites",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar3 = std::operator<<(stream,"<");
  std::operator<<(poVar3,(string *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"tests",&local_71);
  local_9c = UnitTest::reportable_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  StreamableToString<int>(&local_98,&local_9c);
  OutputXmlAttribute(stream,(string *)local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"failures",&local_c1);
  local_ec = UnitTest::failed_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  StreamableToString<int>(&local_e8,&local_ec);
  OutputXmlAttribute(stream,(string *)local_38,&local_c0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"disabled",&local_111);
  local_13c = UnitTest::reportable_disabled_test_count((UnitTest *)kTestsuites.field_2._8_8_);
  StreamableToString<int>(&local_138,&local_13c);
  OutputXmlAttribute(stream,(string *)local_38,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"errors",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"0",&local_189);
  OutputXmlAttribute(stream,(string *)local_38,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"time",&local_1b1);
  piVar4 = (internal *)UnitTest::elapsed_time((UnitTest *)kTestsuites.field_2._8_8_);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_1d8,piVar4,ms);
  OutputXmlAttribute(stream,(string *)local_38,&local_1b0,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"timestamp",&local_1f9);
  piVar4 = (internal *)UnitTest::start_timestamp((UnitTest *)kTestsuites.field_2._8_8_);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_220,piVar4,ms_00);
  OutputXmlAttribute(stream,(string *)local_38,&local_1f8,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_240,"random_seed",&local_241);
    local_26c = UnitTest::random_seed((UnitTest *)kTestsuites.field_2._8_8_);
    StreamableToString<int>(&local_268,&local_26c);
    OutputXmlAttribute(stream,(string *)local_38,&local_240,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
  }
  pTVar5 = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
  TestPropertiesAsXmlAttributes_abi_cxx11_(&local_290,(XmlUnitTestResultPrinter *)pTVar5,result);
  std::operator<<(stream,(string *)&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"name",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"AllTests",&local_2d9);
  OutputXmlAttribute(stream,(string *)local_38,&local_2b0,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::operator<<(stream,">\n");
  for (local_2e0 = 0;
      iVar2 = UnitTest::total_test_suite_count((UnitTest *)kTestsuites.field_2._8_8_),
      local_2e0 < iVar2; local_2e0 = local_2e0 + 1) {
    pTVar6 = UnitTest::GetTestSuite((UnitTest *)kTestsuites.field_2._8_8_,local_2e0);
    iVar2 = TestSuite::reportable_test_count(pTVar6);
    if (0 < iVar2) {
      pTVar6 = UnitTest::GetTestSuite((UnitTest *)kTestsuites.field_2._8_8_,local_2e0);
      PrintXmlTestSuite(stream,pTVar6);
    }
  }
  pTVar5 = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
  bVar1 = TestResult::Failed(pTVar5);
  if (bVar1) {
    pTVar5 = UnitTest::ad_hoc_test_result((UnitTest *)kTestsuites.field_2._8_8_);
    OutputXmlTestSuiteForTestResult(stream,pTVar5);
  }
  poVar3 = std::operator<<(stream,"</");
  poVar3 = std::operator<<(poVar3,(string *)local_38);
  std::operator<<(poVar3,">\n");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));

  if (GTEST_FLAG(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }
  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0)
      PrintXmlTestSuite(stream, *unit_test.GetTestSuite(i));
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputXmlTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "</" << kTestsuites << ">\n";
}